

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<unsigned_long_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<unsigned_long_const&> *this,
          unsigned_long *rhs)

{
  lest *this_00;
  unsigned_long *in_R8;
  allocator<char> local_69;
  string local_68 [32];
  string local_48;
  bool local_21;
  string *local_20;
  unsigned_long *rhs_local;
  expression_lhs<const_unsigned_long_&> *this_local;
  
  local_21 = **(unsigned_long **)this == *rhs;
  this_00 = *(lest **)this;
  local_20 = (string *)rhs;
  rhs_local = (unsigned_long *)this;
  this_local = (expression_lhs<const_unsigned_long_&> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"==",&local_69);
  to_string<unsigned_long,unsigned_long>(&local_48,this_00,(unsigned_long *)local_68,local_20,in_R8)
  ;
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }